

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_slice(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQSharedState *ss;
  SQRESULT SVar3;
  SQObjectValue this;
  long lVar4;
  char *err;
  long lVar5;
  long nidx;
  SQObjectPtr t;
  SQObjectPtr o;
  SQInteger eidx;
  SQObjectPtr local_78;
  SQObjectPtr local_68;
  HSQUIRRELVM local_58;
  long local_50;
  long local_48;
  SQObjectPtr local_40;
  
  local_68.super_SQObject._type = OT_NULL;
  local_68.super_SQObject._unVal.pTable = (SQTable *)0x0;
  get_slice_params(v,&local_48,&local_50,&local_68);
  uVar2 = (local_68.super_SQObject._unVal.pOuter)->_idx;
  lVar5 = (local_48 >> 0x3f & uVar2) + local_48;
  lVar4 = (local_50 >> 0x3f & uVar2) + local_50;
  if (lVar4 < lVar5) {
    err = "wrong indexes";
  }
  else {
    if (lVar4 <= (long)uVar2 && -1 < lVar5) {
      ss = v->_sharedstate;
      local_58 = v;
      this.pUserPointer = sq_vm_malloc(0x48);
      SQArray::SQArray(this.pArray,ss,lVar4 - lVar5);
      local_78.super_SQObject._type = OT_NULL;
      local_78.super_SQObject._unVal.pTable = (SQTable *)0x0;
      if (lVar5 < lVar4) {
        nidx = 0;
        do {
          SQArray::Get(local_68.super_SQObject._unVal.pArray,nidx + lVar5,&local_78);
          SQArray::Set(this.pArray,nidx,&local_78);
          nidx = nidx + 1;
        } while ((lVar5 - lVar4) + nidx != 0);
      }
      local_40.super_SQObject._type = OT_ARRAY;
      pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_40.super_SQObject._unVal.pUserPointer = this.pUserPointer;
      SQVM::Push(local_58,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_78);
      SVar3 = 1;
      goto LAB_00130227;
    }
    err = "slice out of range";
  }
  SVar3 = sq_throwerror(v,err);
LAB_00130227:
  SQObjectPtr::~SQObjectPtr(&local_68);
  return SVar3;
}

Assistant:

static SQInteger array_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(get_slice_params(v,sidx,eidx,o)==-1)return -1;
    SQInteger alen = _array(o)->Size();
    if(sidx < 0)sidx = alen + sidx;
    if(eidx < 0)eidx = alen + eidx;
    if(eidx < sidx)return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > alen || sidx < 0)return sq_throwerror(v, _SC("slice out of range"));
    SQArray *arr=SQArray::Create(_ss(v),eidx-sidx);
    SQObjectPtr t;
    SQInteger count=0;
    for(SQInteger i=sidx;i<eidx;i++){
        _array(o)->Get(i,t);
        arr->Set(count++,t);
    }
    v->Push(arr);
    return 1;

}